

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool bloaty::RollupOutput::IsSame(string *a,string *b)

{
  string_view sVar1;
  __type _Var2;
  bool bVar3;
  string *in_RSI;
  string *in_RDI;
  string_view sVar4;
  bool local_a6;
  string local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  string local_58 [32];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  string *local_18;
  string *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  _Var2 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (_Var2) {
    local_1 = true;
  }
  else {
    local_28 = std::__cxx11::string::operator_cast_to_basic_string_view(local_18);
    std::operator+(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
    sVar4._M_str = in_stack_ffffffffffffffa0;
    sVar4._M_len = in_stack_ffffffffffffff98;
    sVar1._M_str = in_stack_ffffffffffffff90;
    sVar1._M_len = (size_t)in_stack_ffffffffffffff88;
    bVar3 = absl::EndsWith(sVar4,sVar1);
    local_a6 = true;
    if (!bVar3) {
      sVar4 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_10);
      std::operator+(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
      sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_98);
      local_a6 = absl::EndsWith(sVar4,sVar1);
      std::__cxx11::string::~string(local_98);
    }
    std::__cxx11::string::~string(local_58);
    if (local_a6 == false) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool RollupOutput::IsSame(const std::string& a, const std::string& b) {
  if (a == b) {
    return true;
  }

  if (absl::EndsWith(b, a + "]") || absl::EndsWith(a, b + "]")) {
    return true;
  }

  return false;
}